

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall
ON_NurbsSurface::Create
          (ON_NurbsSurface *this,int dim,bool is_rat,int order0,int order1,int cv_count0,
          int cv_count1)

{
  bool bVar1;
  int iVar2;
  int local_3c;
  bool local_2d;
  bool rc;
  int cv_count0_local;
  int order1_local;
  int order0_local;
  bool is_rat_local;
  int dim_local;
  ON_NurbsSurface *this_local;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  if (dim < 1) {
    this_local._7_1_ = false;
  }
  else if (order0 < 2) {
    this_local._7_1_ = false;
  }
  else if (order1 < 2) {
    this_local._7_1_ = false;
  }
  else if (cv_count0 < order0) {
    this_local._7_1_ = false;
  }
  else if (cv_count1 < order1) {
    this_local._7_1_ = false;
  }
  else {
    this->m_dim = dim;
    this->m_is_rat = (uint)(-is_rat & 1);
    this->m_order[0] = order0;
    this->m_order[1] = order1;
    this->m_cv_count[0] = cv_count0;
    this->m_cv_count[1] = cv_count1;
    if (this->m_is_rat == 0) {
      local_3c = this->m_dim;
    }
    else {
      local_3c = this->m_dim + 1;
    }
    this->m_cv_stride[1] = local_3c;
    this->m_cv_stride[0] = this->m_cv_stride[1] * this->m_cv_count[1];
    iVar2 = KnotCount(this,0);
    local_2d = ReserveKnotCapacity(this,0,iVar2);
    iVar2 = KnotCount(this,1);
    bVar1 = ReserveKnotCapacity(this,1,iVar2);
    if (!bVar1) {
      local_2d = false;
    }
    bVar1 = ReserveCVCapacity(this,this->m_cv_count[0] * this->m_cv_count[1] * this->m_cv_stride[1])
    ;
    if (!bVar1) {
      local_2d = false;
    }
    this_local._7_1_ = local_2d;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsSurface::Create(
        int dim,      // dimension (>= 1)
        bool is_rat,  // true to make a rational NURBS
        int order0,    // order (>= 2)
        int order1,    // order (>= 2)
        int cv_count0,  // cv count0 (>= order0)
        int cv_count1   // cv count1 (>= order1)
        )
{
  DestroySurfaceTree();
  if ( dim < 1 )
    return false;
  if ( order0 < 2 )
    return false;
  if ( order1 < 2 )
    return false;
  if ( cv_count0 < order0 )
    return false;
  if ( cv_count1 < order1 )
    return false;
  m_dim = dim;
  m_is_rat = (is_rat) ? true : false;
  m_order[0] = order0;
  m_order[1] = order1;
  m_cv_count[0] = cv_count0;
  m_cv_count[1] = cv_count1;
  m_cv_stride[1] = (m_is_rat) ? m_dim+1 : m_dim;
  m_cv_stride[0] = m_cv_stride[1]*m_cv_count[1];
  bool rc = ReserveKnotCapacity( 0, KnotCount(0) );
  if ( !ReserveKnotCapacity( 1, KnotCount(1) ) )
    rc = false;
  if ( !ReserveCVCapacity( m_cv_count[0]*m_cv_count[1]*m_cv_stride[1] ) )
    rc = false;
  return rc;
}